

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
tf::SmallVectorImpl<tf::Node*>::append<tf::Node**>
          (SmallVectorImpl<tf::Node*> *this,Node **in_start,Node **in_end)

{
  ulong __n;
  
  __n = (long)in_end - (long)in_start;
  if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) < __n) {
    SmallVectorBase::grow_pod
              ((SmallVectorBase *)this,this + 0x18,
               (*(long *)(this + 8) + __n) - *(long *)this & 0xfffffffffffffff8,8);
  }
  if (in_start != in_end) {
    memcpy(*(void **)(this + 8),in_start,__n);
  }
  *(ulong *)(this + 8) = *(long *)(this + 8) + __n;
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }